

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::Interpreter::BaThreadIfStatusToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,uint32_t aIfStatus)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "active";
    pcVar1 = "";
  }
  else if (iVar2 == 1) {
    pcVar3 = "inactive";
    pcVar1 = "";
  }
  else if (iVar2 == 0) {
    pcVar3 = "uninitialized";
    pcVar1 = "";
  }
  else {
    pcVar3 = "reserved";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::BaThreadIfStatusToString(uint32_t aIfStatus)
{
    switch (aIfStatus)
    {
    case 0:
        return "uninitialized";
    case 1:
        return "inactive";
    case 2:
        return "active";
    default:
        return "reserved";
    }
}